

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ParameterTests.cpp
# Opt level: O2

void addMeanSquareError<CoreML::Specification::NeuralNetworkClassifier>
               (Model *m,NeuralNetworkClassifier *nn,char *lossName,char *mseInputName,
               char *targetName)

{
  ulong uVar1;
  NetworkUpdateParameters *pNVar2;
  LossLayer *this;
  MeanSquaredErrorLossLayer *pMVar3;
  Type *from;
  ModelDescription *pMVar4;
  FeatureDescription *this_00;
  undefined8 *puVar5;
  undefined1 *puVar6;
  FeatureDescription output;
  FeatureDescription FStack_58;
  
  pNVar2 = CoreML::Specification::NeuralNetworkClassifier::_internal_mutable_updateparams(nn);
  this = google::protobuf::RepeatedPtrField<CoreML::Specification::LossLayer>::Add
                   (&pNVar2->losslayers_);
  uVar1 = (this->super_MessageLite)._internal_metadata_.ptr_;
  puVar5 = (undefined8 *)(uVar1 & 0xfffffffffffffffc);
  if ((uVar1 & 1) != 0) {
    puVar5 = (undefined8 *)*puVar5;
  }
  google::protobuf::internal::ArenaStringPtr::
  Set<google::protobuf::internal::ArenaStringPtr::EmptyDefault>(&this->name_,lossName,puVar5);
  pMVar3 = CoreML::Specification::LossLayer::_internal_mutable_meansquarederrorlosslayer(this);
  uVar1 = (pMVar3->super_MessageLite)._internal_metadata_.ptr_;
  puVar5 = (undefined8 *)(uVar1 & 0xfffffffffffffffc);
  if ((uVar1 & 1) != 0) {
    puVar5 = (undefined8 *)*puVar5;
  }
  google::protobuf::internal::ArenaStringPtr::
  Set<google::protobuf::internal::ArenaStringPtr::EmptyDefault>(&pMVar3->input_,mseInputName,puVar5)
  ;
  uVar1 = (pMVar3->super_MessageLite)._internal_metadata_.ptr_;
  puVar5 = (undefined8 *)(uVar1 & 0xfffffffffffffffc);
  if ((uVar1 & 1) != 0) {
    puVar5 = (undefined8 *)*puVar5;
  }
  google::protobuf::internal::ArenaStringPtr::
  Set<google::protobuf::internal::ArenaStringPtr::EmptyDefault>(&pMVar3->target_,targetName,puVar5);
  puVar6 = (undefined1 *)m->description_;
  if ((ModelDescription *)puVar6 == (ModelDescription *)0x0) {
    puVar6 = CoreML::Specification::_ModelDescription_default_instance_;
  }
  from = google::protobuf::internal::RepeatedPtrFieldBase::
         Get<google::protobuf::RepeatedPtrField<CoreML::Specification::FeatureDescription>::TypeHandler>
                   (&(((ModelDescription *)puVar6)->output_).super_RepeatedPtrFieldBase,0);
  CoreML::Specification::FeatureDescription::FeatureDescription(&FStack_58,from);
  pMVar4 = CoreML::Specification::Model::_internal_mutable_description(m);
  this_00 = google::protobuf::RepeatedPtrField<CoreML::Specification::FeatureDescription>::Add
                      (&pMVar4->traininginput_);
  CoreML::Specification::FeatureDescription::CopyFrom(this_00,&FStack_58);
  uVar1 = (this_00->super_MessageLite)._internal_metadata_.ptr_;
  puVar5 = (undefined8 *)(uVar1 & 0xfffffffffffffffc);
  if ((uVar1 & 1) != 0) {
    puVar5 = (undefined8 *)*puVar5;
  }
  google::protobuf::internal::ArenaStringPtr::Set
            (&this_00->name_,(ulong)(pMVar3->target_).tagged_ptr_.ptr_ & 0xfffffffffffffffe,puVar5);
  CoreML::Specification::FeatureDescription::~FeatureDescription(&FStack_58);
  return;
}

Assistant:

void addMeanSquareError(Specification::Model& m, NeuralNetworkClass *nn, const char *lossName, const char *mseInputName, const char *targetName) {

    // set a MSE loss layer
    Specification::NetworkUpdateParameters *updateParams = nn->mutable_updateparams();
    Specification::LossLayer *lossLayer = updateParams->add_losslayers();
    lossLayer->set_name(lossName);
    Specification::MeanSquaredErrorLossLayer *mseLossLayer = lossLayer->mutable_meansquarederrorlosslayer();
    mseLossLayer->set_input(mseInputName);
    mseLossLayer->set_target(targetName);

    auto output = m.description().output(0);
    auto trainingInput = m.mutable_description()->mutable_traininginput()->Add();
    trainingInput->CopyFrom(output);
    trainingInput->set_name(mseLossLayer->target());

}